

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

int ColorToInt(Color color)

{
  return (uint)color >> 0x18 | ((uint)color & 0xff0000) >> 8 | ((uint)color & 0xff00) << 8 |
         (int)color << 0x18;
}

Assistant:

int ColorToInt(Color color)
{
    int result = 0;

    result = (int)(((unsigned int)color.r << 24) |
                   ((unsigned int)color.g << 16) |
                   ((unsigned int)color.b << 8) |
                    (unsigned int)color.a);

    return result;
}